

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTable.h
# Opt level: O2

void __thiscall glslang::TFunction::removePrefix(TFunction *this,TString *prefix)

{
  int iVar1;
  
  iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          compare(&this->mangledName,0,prefix->_M_string_length,prefix);
  if (iVar1 == 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::erase
              (&this->mangledName,0,prefix->_M_string_length);
    return;
  }
  __assert_fail("mangledName.compare(0, prefix.size(), prefix) == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/SymbolTable.h"
                ,0x127,"virtual void glslang::TFunction::removePrefix(const TString &)");
}

Assistant:

virtual void removePrefix(const TString& prefix)
    {
        assert(mangledName.compare(0, prefix.size(), prefix) == 0);
        mangledName.erase(0, prefix.size());
    }